

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintNodes(Wlc_Ntk_t *p,int Type)

{
  uint uVar1;
  char *pcVar2;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  int *piVar8;
  uint *puVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  pcVar2 = Wlc_Names[Type];
  printf("Operation %s\n",pcVar2);
  iVar5 = p->iObj;
  if (1 < iVar5) {
    uVar12 = 1;
    lVar13 = 0x28;
    uVar11 = 0;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar12) goto LAB_002fb12c;
      pWVar3 = p->pObjs;
      if ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) == Type) {
        printf("%8d  :",(ulong)uVar11);
        printf("%8d  :  ",uVar12 & 0xffffffff);
        pcVar10 = "s";
        if ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x40) == 0) {
          pcVar10 = " ";
        }
        printf("%3d%s = ",
               (ulong)((*(int *)((long)pWVar3 + lVar13 + -8) - *(int *)((long)pWVar3 + lVar13 + -4))
                      + 1),pcVar10);
        uVar1 = *(uint *)((long)pWVar3 + lVar13 + -0xc);
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          piVar8 = (int *)(&pWVar3->field_0x0 + lVar13);
        }
        else {
          piVar8 = *(int **)(&pWVar3->field_0x0 + lVar13);
        }
        lVar6 = (long)*piVar8;
        if ((lVar6 < 1) || (p->nObjsAlloc <= *piVar8)) {
LAB_002fb12c:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          puVar9 = (uint *)(&pWVar3->field_0x0 + lVar13);
        }
        else {
          puVar9 = *(uint **)(&pWVar3->field_0x0 + lVar13);
        }
        uVar1 = *puVar9;
        if (((long)(int)uVar1 < 1) || ((uint)p->nObjsAlloc <= uVar1)) goto LAB_002fb12c;
        pWVar4 = p->pObjs;
        pcVar10 = "s";
        if ((undefined1  [24])((undefined1  [24])pWVar4[(int)uVar1] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          pcVar10 = " ";
        }
        printf("%3d%s  %s ",(ulong)((pWVar4[lVar6].End - pWVar4[lVar6].Beg) + 1),pcVar10,pcVar2);
        uVar1 = *(uint *)((long)pWVar3 + lVar13 + -0xc);
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar3->field_0x0 + lVar13;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar3->field_0x0 + lVar13);
        }
        lVar6 = (long)(int)*(uint *)(puVar7 + 4);
        if ((lVar6 < 1) || (p->nObjsAlloc <= (int)*(uint *)(puVar7 + 4))) goto LAB_002fb12c;
        if ((uVar1 < 3) && ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar3->field_0x0 + lVar13;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar3->field_0x0 + lVar13);
        }
        uVar1 = *(uint *)(puVar7 + 4);
        if (((long)(int)uVar1 < 1) || ((uint)p->nObjsAlloc <= uVar1)) goto LAB_002fb12c;
        pWVar4 = p->pObjs;
        pcVar10 = "s";
        if ((undefined1  [24])((undefined1  [24])pWVar4[(int)uVar1] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          pcVar10 = " ";
        }
        printf("%3d%s ",(ulong)((pWVar4[lVar6].End - pWVar4[lVar6].Beg) + 1),pcVar10);
        printf(" :    ");
        pcVar10 = Wlc_ObjName(p,(int)uVar12);
        printf("%-12s =  ",pcVar10);
        if ((*(uint *)((long)pWVar3 + lVar13 + -0xc) < 3) &&
           ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          piVar8 = (int *)(&pWVar3->field_0x0 + lVar13);
        }
        else {
          piVar8 = *(int **)(&pWVar3->field_0x0 + lVar13);
        }
        pcVar10 = Wlc_ObjName(p,*piVar8);
        printf("%-12s  %s  ",pcVar10,pcVar2);
        if ((*(uint *)((long)pWVar3 + lVar13 + -0xc) < 3) &&
           ((*(ushort *)((long)pWVar3 + lVar13 + -0x10) & 0x3f) != 6)) {
          puVar7 = &pWVar3->field_0x0 + lVar13;
        }
        else {
          puVar7 = *(undefined1 **)(&pWVar3->field_0x0 + lVar13);
        }
        uVar11 = uVar11 + 1;
        pcVar10 = Wlc_ObjName(p,*(uint *)(puVar7 + 4));
        printf("%-12s ",pcVar10);
        putchar(10);
        iVar5 = p->iObj;
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x18;
    } while ((long)uVar12 < (long)iVar5);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodes( Wlc_Ntk_t * p, int Type )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    printf( "Operation %s\n", Wlc_Names[Type] );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( (int)pObj->Type != Type )
            continue;
        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Wlc_ObjRange(pObj),                   Wlc_ObjIsSigned(pObj) ? "s" : " " );
        printf( "%3d%s  %s ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[Type] );
        printf( "%3d%s ",      Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Wlc_ObjName(p, i) );
        printf( "%-12s  %s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[Type] );
        printf( "%-12s ",      Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        printf( "\n" );
    }
}